

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indextest.cpp
# Opt level: O2

int testEscapedChars(void)

{
  VRDataIndex *pVVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  VRAnyCoreType VVar6;
  long lVar7;
  bool bVar8;
  allocator<char> local_11a;
  allocator<char> local_119;
  VRDataIndex *local_118;
  int local_10c;
  VRStringArray s;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string inString;
  
  iVar5 = 0;
  bVar8 = true;
  while( true ) {
    if (!bVar8) break;
    local_10c = iVar5;
    local_118 = setupIndex();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&inString,
               "<mimi type=\"stringarray\" separator=\",\">Alpha,Beta,Gamma\\,Delta,Epsilon</mimi>",
               (allocator<char> *)&local_90);
    std::__cxx11::string::string((string *)&local_d0,(string *)&inString);
    std::__cxx11::string::string
              ((string *)&local_f0,(string *)MinVR::VRDataIndex::rootNameSpace_abi_cxx11_);
    MinVR::VRDataIndex::addSerializedValue(&local_70,local_118,&local_d0,&local_f0,true);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"/mimi",&local_119);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"",&local_11a);
    VVar6 = MinVR::VRDataIndex::getValue(local_118,&local_90,&local_b0,true);
    (*(VVar6.datum)->_vptr_VRDatum[0xf])(&s,VVar6.datum);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    lVar7 = (long)s.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)s.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    iVar2 = std::__cxx11::string::compare
                      ((char *)s.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
    iVar3 = std::__cxx11::string::compare
                      ((char *)(s.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 1));
    iVar4 = std::__cxx11::string::compare
                      ((char *)(s.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 2));
    iVar5 = std::__cxx11::string::compare
                      ((char *)(s.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 3));
    pVVar1 = local_118;
    iVar5 = iVar2 + local_10c + iVar3 + iVar4 + (uint)(lVar7 != 0x80) + iVar5;
    MinVR::VRDataIndex::~VRDataIndex(local_118);
    operator_delete(pVVar1,0x98);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&s);
    std::__cxx11::string::~string((string *)&inString);
    bVar8 = false;
  }
  return iVar5;
}

Assistant:

int testEscapedChars() {

  int out = 0;

  LOOP {

    MinVR::VRDataIndex *n = setupIndex();

    // Escaping the comma separator between Gamma and Delta.
    std::string inString = "<mimi type=\"stringarray\" separator=\",\">Alpha,Beta,Gamma\\,Delta,Epsilon</mimi>";
    n->addSerializedValue(inString, MinVR::VRDataIndex::rootNameSpace);

    MinVR::VRStringArray s = n->getValue("/mimi");

    out += (s.size() == 4) ? 0 : 1;

    out += s[0].compare("Alpha");
    out += s[1].compare("Beta");
    out += s[2].compare("Gamma,Delta");
    out += s[3].compare("Epsilon");

    //    std::cout << inString << std::endl;
    //    std::cout << s[0] << "/"  << s[1] << "/"  << s[2] << "/"  << s[3] << "/" << std::endl;
    delete n;
  }